

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

MMDB_lookup_result_s *
MMDB_lookup_string(MMDB_lookup_result_s *__return_storage_ptr__,MMDB_s *mmdb,char *ipstr,
                  int *gai_error,int *mmdb_error)

{
  int iVar1;
  MMDB_lookup_result_s *result;
  MMDB_s *local_48;
  uint32_t local_40;
  undefined4 uStack_3c;
  uint16_t local_38;
  undefined6 uStack_36;
  addrinfo *local_30;
  addrinfo *addresses;
  int *mmdb_error_local;
  int *gai_error_local;
  char *ipstr_local;
  MMDB_s *mmdb_local;
  
  addresses = (addrinfo *)mmdb_error;
  mmdb_error_local = gai_error;
  gai_error_local = (int *)ipstr;
  ipstr_local = (char *)mmdb;
  memset(__return_storage_ptr__,0,0x20);
  (__return_storage_ptr__->entry).mmdb = (MMDB_s *)ipstr_local;
  local_30 = (addrinfo *)0x0;
  iVar1 = resolve_any_address((char *)gai_error_local,&local_30);
  *mmdb_error_local = iVar1;
  if (*mmdb_error_local == 0) {
    MMDB_lookup_sockaddr
              ((MMDB_lookup_result_s *)&result,(MMDB_s *)ipstr_local,local_30->ai_addr,
               &addresses->ai_flags);
    *(MMDB_lookup_result_s **)__return_storage_ptr__ = result;
    (__return_storage_ptr__->entry).mmdb = local_48;
    (__return_storage_ptr__->entry).offset = local_40;
    *(undefined4 *)&(__return_storage_ptr__->entry).field_0xc = uStack_3c;
    __return_storage_ptr__->netmask = local_38;
    *(undefined6 *)&__return_storage_ptr__->field_0x1a = uStack_36;
  }
  if (local_30 != (addrinfo *)0x0) {
    freeaddrinfo((addrinfo *)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

MMDB_lookup_result_s MMDB_lookup_string(const MMDB_s *const mmdb,
                                        const char *const ipstr,
                                        int *const gai_error,
                                        int *const mmdb_error) {
    MMDB_lookup_result_s result = {.found_entry = false,
                                   .netmask = 0,
                                   .entry = {.mmdb = mmdb, .offset = 0}};

    struct addrinfo *addresses = NULL;
    *gai_error = resolve_any_address(ipstr, &addresses);

    if (!*gai_error) {
        result = MMDB_lookup_sockaddr(mmdb, addresses->ai_addr, mmdb_error);
    }

    if (NULL != addresses) {
        freeaddrinfo(addresses);
    }

    return result;
}